

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

string * __thiscall
ELFIO::dump::find_value_in_table<ELFIO::dynamic_tag_t[55],unsigned_long>
          (string *__return_storage_ptr__,dump *this,dynamic_tag_t (*table) [55],unsigned_long *key)

{
  uint local_38;
  uint i;
  allocator<char> local_22;
  undefined1 local_21;
  dynamic_tag_t (*local_20) [55];
  unsigned_long *key_local;
  dynamic_tag_t (*table_local) [55];
  string *res;
  
  local_21 = 0;
  local_20 = table;
  key_local = (unsigned_long *)this;
  table_local = (dynamic_tag_t (*) [55])__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"?",&local_22)
  ;
  std::allocator<char>::~allocator(&local_22);
  local_38 = 0;
  while( true ) {
    if (0x36 < local_38) {
      return __return_storage_ptr__;
    }
    if ((ulong)(uint)key_local[(ulong)local_38 * 2] == *(ulong *)*local_20) break;
    local_38 = local_38 + 1;
  }
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(char *)key_local[(ulong)local_38 * 2 + 1]);
  return __return_storage_ptr__;
}

Assistant:

std::string static find_value_in_table( const T& table, const K& key )
    {
        std::string res = "?";
        for ( unsigned int i = 0; i < sizeof( table ) / sizeof( table[0] );
              ++i ) {
            if ( table[i].key == key ) {
                res = table[i].str;
                break;
            }
        }

        return res;
    }